

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_reporter.c
# Opt level: O0

void show_incomplete(TestReporter *reporter,char *file,int line,char *message,
                    __va_list_tag *arguments)

{
  _Bool _Var1;
  CgreenBreadcrumb *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  TestReporter *in_RDI;
  _func_void_char_ptr_void_ptr *in_R8;
  TextMemo *memo;
  undefined8 *memo_00;
  
  memo_00 = (undefined8 *)in_RDI->memo;
  _Var1 = have_quiet_mode(in_RDI);
  if (_Var1) {
    (*(code *)*memo_00)("\n");
  }
  (*(code *)*memo_00)("%s:%d: ",in_RSI,in_EDX);
  (*(code *)*memo_00)("Exception: ");
  *(undefined4 *)(memo_00 + 2) = 0;
  walk_breadcrumb(in_RCX,in_R8,memo_00);
  (*(code *)*memo_00)("\n\t");
  if (in_RCX == (CgreenBreadcrumb *)0x0) {
    (*(code *)*memo_00)(
                       "Test terminated unexpectedly, likely from a non-standard exception or Posix signal"
                       );
  }
  else {
    (*(code *)memo_00[1])(in_RCX,in_R8);
  }
  (*(code *)*memo_00)("\n");
  (*(code *)*memo_00)("\n");
  fflush((FILE *)0x0);
  return;
}

Assistant:

static void show_incomplete(TestReporter *reporter, const char *file, int line,
                            const char *message, va_list arguments) {
    TextMemo *memo = (TextMemo *)reporter->memo;

    if (have_quiet_mode(reporter))
        memo->printer("\n");    /* To break line of "....." for error message parsing */
    memo->printer("%s:%d: ", file, line);
    memo->printer("Exception: ");

    memo->depth = 0;
    walk_breadcrumb((CgreenBreadcrumb *) reporter->breadcrumb, &show_breadcrumb,
                    memo);

    memo->printer("\n\t");
    if (message == NULL) {
        memo->printer("Test terminated unexpectedly, "
                "likely from a non-standard exception or Posix signal");
    } else {
        memo->vprinter(message, arguments);
    }
    memo->printer("\n");
    memo->printer("\n");
    fflush(NULL);
}